

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,SMatrix<double,_3,_3> *a)

{
  int k;
  long lVar1;
  long lVar2;
  char c;
  char local_29;
  
  std::operator>>(in,&local_29);
  if (local_29 == '[') {
    lVar1 = 0;
    do {
      if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) break;
      lVar2 = 0;
      do {
        if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) break;
        std::istream::_M_extract<double>((double *)in);
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
      std::operator>>(in,&local_29);
      if ((lVar1 != 2) && (local_29 != ';')) {
        std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    if (local_29 == ']') {
      return in;
    }
  }
  std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
  return in;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, SMatrix<T, nrows, ncols> &a)
{
  char c;

  in >> c;

  if (c == '[')
  {
    for (int k=0; k<nrows && in; k++)
    {
      for (int i=0; i<ncols && in; i++)
      {
        in >> a(k, i);
      }

      in >> c;

      if (k+1 < nrows && c != ';')
      {
        in.setstate(std::ios_base::failbit);
      }
    }

    if (c != ']')
    {
      in.setstate(std::ios_base::failbit);
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}